

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Vec_Int_t * Cba_NtkCollectDfs(Cba_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint i_00;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  char *pcVar5;
  char *local_b0;
  int iObj_1;
  Vec_Int_t *vObjs;
  int local_20;
  int iFanin;
  int iFin;
  int iObj;
  int k;
  int i;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkObjNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (iObj = 0; iVar1 = Cba_NtkPiNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkPi(p,iObj);
    Vec_IntPush(p_00,iVar1);
  }
  for (iObj = 0; iVar1 = Cba_NtkBoxSeqNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkBoxSeq(p,iObj);
    Vec_IntPush(p_00,iVar1);
  }
  Cba_NtkCleanObjCopies(p);
  for (iObj = 0; iVar1 = Vec_IntSize(p_00), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(p_00,iObj);
    Cba_ObjSetCopy(p,iVar1,0);
  }
  for (iObj = 0; iVar1 = Cba_NtkPoNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkPo(p,iObj);
    for (local_20 = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), local_20 < iVar2;
        local_20 = local_20 + 1) {
      iVar2 = Cba_FinFon(p,local_20);
      iVar2 = Cba_FonObj(p,iVar2);
      if (iVar2 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar2,p_00);
      }
    }
  }
  for (iObj = 0; iVar1 = Cba_NtkBoxSeqNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkBoxSeq(p,iObj);
    for (local_20 = Cba_ObjFin0(p,iVar1); iVar2 = Cba_ObjFin0(p,iVar1 + 1), local_20 < iVar2;
        local_20 = local_20 + 1) {
      iVar2 = Cba_FinFon(p,local_20);
      iVar2 = Cba_FonObj(p,iVar2);
      if (iVar2 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar2,p_00);
      }
    }
  }
  for (iObj = 0; iVar1 = Cba_NtkPoNum(p), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Cba_NtkPo(p,iObj);
    Vec_IntPush(p_00,iVar1);
  }
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Cba_NtkObjNum(p);
  if (iVar1 <= iVar2) {
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Cba_NtkObjNum(p);
    if (iVar1 != iVar2) {
      iVar1 = Cba_NtkObjNum(p);
      i_00 = Cba_NtkFindMissing(p_00,iVar1);
      pcVar5 = Cba_NtkName(p);
      uVar3 = Vec_IntSize(p_00);
      uVar4 = Cba_NtkObjNum(p);
      printf("Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n",pcVar5,
             (ulong)uVar3,(ulong)uVar4);
      if ((int)i_00 < 1) {
        local_b0 = "<unknown>";
      }
      else {
        iVar1 = Cba_ObjFon0(p,i_00);
        local_b0 = Cba_FonNameStr(p,iVar1);
      }
      printf("         For example, object %d with name \"%s\" is not reachable from outputs.\n",
             (ulong)i_00,local_b0);
    }
    return p_00;
  }
  __assert_fail("Vec_IntSize(vObjs) <= Cba_NtkObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x296,"Vec_Int_t *Cba_NtkCollectDfs(Cba_Ntk_t *)");
}

Assistant:

Vec_Int_t * Cba_NtkCollectDfs( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin;
    Vec_Int_t * vObjs = Vec_IntAlloc( Cba_NtkObjNum(p) );
    // collect PIs and seq boxes
    Cba_NtkForEachPi( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    // prepare leaves
    Cba_NtkCleanObjCopies( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjSetCopy( p, iObj, 0 );
    // collect internal
    Cba_NtkForEachPo( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    // collect POs
    Cba_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    assert( Vec_IntSize(vObjs) <= Cba_NtkObjNum(p) );
    if ( Vec_IntSize(vObjs) != Cba_NtkObjNum(p) )
    {
        int iObj = Cba_NtkFindMissing( vObjs, Cba_NtkObjNum(p) );
        printf( "Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n", Cba_NtkName(p), Vec_IntSize(vObjs), Cba_NtkObjNum(p) );
        printf( "         For example, object %d with name \"%s\" is not reachable from outputs.\n", 
            iObj, iObj > 0 ? Cba_FonNameStr( p, Cba_ObjFon0(p, iObj) ) : "<unknown>" );
    }
    return vObjs;
}